

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool __thiscall
ON_Brep::CollapseEdge(ON_Brep *this,int edge_index,bool bCloseTrimGap,int vertex_index)

{
  uint uVar1;
  int iVar2;
  ON_BrepTrim *pOVar3;
  int iVar4;
  ON_BrepEdge *pOVar5;
  ON_BrepVertex *pOVar6;
  long lVar7;
  undefined7 in_register_00000011;
  int *x;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  int i;
  ON_SimpleArray<int> ti;
  ON_SimpleArray<int> next_ti;
  ON_SimpleArray<int> prev_ti;
  ON_SimpleArray<int> li;
  int local_bc;
  ulong local_b8;
  ON_BrepEdge *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  undefined4 local_9c;
  long local_98;
  ON_SimpleArray<int> local_90;
  ON_SimpleArray<int> local_78;
  ON_SimpleArray<int> local_60;
  ON_SimpleArray<int> local_48;
  
  local_9c = (undefined4)CONCAT71(in_register_00000011,bCloseTrimGap);
  pOVar5 = Edge(this,edge_index);
  if (pOVar5 != (ON_BrepEdge *)0x0) {
    local_a0 = pOVar5->m_vi[0];
    iVar4 = pOVar5->m_vi[1];
    if (vertex_index == -1) {
      vertex_index = local_a0;
    }
    pOVar6 = Vertex(this,vertex_index);
    if (pOVar6 != (ON_BrepVertex *)0x0) {
      uVar1 = (pOVar5->m_ti).m_count;
      uVar8 = (ulong)uVar1;
      local_a4 = iVar4;
      if (0 < (int)uVar1) {
        iVar4 = pOVar6->m_vertex_index;
        local_90._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
        local_90.m_a = (int *)0x0;
        local_90.m_count = 0;
        local_90.m_capacity = 0;
        local_b0 = pOVar5;
        ON_SimpleArray<int>::SetCapacity(&local_90,uVar8);
        local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
        local_48.m_a = (int *)0x0;
        local_48.m_count = 0;
        local_48.m_capacity = 0;
        ON_SimpleArray<int>::SetCapacity(&local_48,uVar8);
        local_60._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
        local_60.m_a = (int *)0x0;
        local_60.m_count = 0;
        local_60.m_capacity = 0;
        ON_SimpleArray<int>::SetCapacity(&local_60,uVar8);
        local_78._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
        local_78.m_a = (int *)0x0;
        local_78.m_count = 0;
        local_78.m_capacity = 0;
        local_a8 = iVar4;
        ON_SimpleArray<int>::SetCapacity(&local_78,uVar8);
        local_98 = -uVar8;
        bVar10 = true;
        uVar9 = 1;
        local_b8 = uVar8;
        do {
          local_bc = (local_b0->m_ti).m_a[uVar9 - 1];
          lVar7 = (long)local_bc;
          if ((-1 < lVar7) &&
             (local_bc <
              (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count
             )) {
            pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            if ((pOVar3[lVar7].m_trim_index != local_bc) ||
               ((((pOVar3[lVar7].m_li < 0 ||
                  ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                   m_count <= pOVar3[lVar7].m_li)) ||
                 (local_bc = PrevTrim(this,pOVar3[lVar7].m_trim_index), local_bc < 0)) ||
                (x = &pOVar3[lVar7].m_trim_index, local_bc == *x)))) goto LAB_0041b4f6;
            ON_SimpleArray<int>::Append(&local_60,&local_bc);
            local_bc = NextTrim(this,*x);
            if ((local_bc < 0) || (local_bc == *x)) goto LAB_0041b4f6;
            ON_SimpleArray<int>::Append(&local_78,&local_bc);
            ON_SimpleArray<int>::Append(&local_90,x);
            ON_SimpleArray<int>::Append(&local_48,&pOVar3[lVar7].m_li);
          }
          iVar4 = local_a8;
          pOVar5 = local_b0;
          bVar10 = uVar9 < local_b8;
          lVar7 = local_98 + uVar9;
          uVar9 = uVar9 + 1;
        } while (lVar7 != 0);
        ChangeVertex(this,local_b0->m_vi[0],local_a8,true);
        ChangeVertex(this,pOVar5->m_vi[1],iVar4,true);
        local_b8 = (ulong)local_90.m_count;
        if (0 < (long)local_b8) {
          uVar8 = 0;
          do {
            local_bc = local_90.m_a[uVar8];
            pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            iVar4 = local_60.m_a[uVar8];
            iVar2 = local_78.m_a[uVar8];
            DeleteTrim(this,pOVar3 + local_bc,false);
            if ((char)local_9c != '\0') {
              CloseTrimGap(this,pOVar3 + iVar4,pOVar3 + iVar2);
            }
            uVar8 = uVar8 + 1;
          } while (local_b8 != uVar8);
        }
LAB_0041b4f6:
        ON_SimpleArray<int>::~ON_SimpleArray(&local_78);
        ON_SimpleArray<int>::~ON_SimpleArray(&local_60);
        ON_SimpleArray<int>::~ON_SimpleArray(&local_48);
        ON_SimpleArray<int>::~ON_SimpleArray(&local_90);
        pOVar5 = local_b0;
        if (bVar10) {
          return false;
        }
      }
      DeleteEdge(this,pOVar5,false);
      pOVar6 = Vertex(this,local_a0);
      if ((pOVar6 != (ON_BrepVertex *)0x0) && (iVar4 = ON_BrepVertex::EdgeCount(pOVar6), iVar4 == 0)
         ) {
        DeleteVertex(this,pOVar6);
      }
      pOVar6 = Vertex(this,local_a4);
      if (pOVar6 != (ON_BrepVertex *)0x0) {
        iVar4 = ON_BrepVertex::EdgeCount(pOVar6);
        if (iVar4 == 0) {
          DeleteVertex(this,pOVar6);
          return true;
        }
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Brep::CollapseEdge( int edge_index, bool bCloseTrimGap, int vertex_index  )
{
  ON_BrepEdge* edge = Edge(edge_index);
  if ( 0 == edge )
    return false;
  edge_index = edge->m_edge_index; // clear high bit

  int orig_vid0 = edge->m_vi[0];
  int orig_vid1 = edge->m_vi[1];

  if ( -1 == vertex_index )
    vertex_index = edge->m_vi[0];
  ON_BrepVertex* vertex = Vertex(vertex_index);
  if ( 0 == vertex )
    return false;
  vertex_index = vertex->m_vertex_index; // clear high bit

  int trim_count = edge->m_ti.Count();
  if ( trim_count > 0 )
  {
    ON_SimpleArray<int> ti(trim_count);
    ON_SimpleArray<int> li(trim_count);
    ON_SimpleArray<int> prev_ti(trim_count);
    ON_SimpleArray<int> next_ti(trim_count);
    int i, eti;
    for ( eti = 0; eti < trim_count; eti++ )
    {
      i = edge->m_ti[eti];
      if ( i < 0 || i >= m_T.Count() )
        continue;
      const ON_BrepTrim& trim = m_T[i];
      if ( trim.m_trim_index != i )
        return false;
      if ( trim.m_li < 0 || trim.m_li >= m_L.Count() )
        return false;
      i = PrevTrim(trim.m_trim_index);
      if ( i < 0 || i == trim.m_trim_index )
        return false;
      prev_ti.Append(i);
      i = NextTrim(trim.m_trim_index);
      if ( i < 0 || i == trim.m_trim_index )
        return false;
      next_ti.Append(i);
      ti.Append(trim.m_trim_index);
      li.Append(trim.m_li);
    }

    ChangeVertex(edge->m_vi[0], vertex_index, true);
    ChangeVertex(edge->m_vi[1], vertex_index, true);
    
    trim_count = ti.Count();
    for ( eti = 0; eti < trim_count; eti++ )
    {
      i = ti[eti];
      ON_BrepTrim& trim = m_T[i];
      //ON_BrepLoop& loop = m_L[li[eti]];
      ON_BrepTrim& prev_trim = m_T[prev_ti[eti]];
      ON_BrepTrim& next_trim = m_T[next_ti[eti]];
      DeleteTrim(trim,false);
      if ( bCloseTrimGap )
        CloseTrimGap(prev_trim,next_trim);
    }
  }

  DeleteEdge(*edge,false);
  ON_BrepVertex* V0 = Vertex(orig_vid0);
  if (V0 && V0->EdgeCount() == 0)
    DeleteVertex(*V0);
  ON_BrepVertex* V1 = Vertex(orig_vid1);
  if (V1 && V1->EdgeCount() == 0)
    DeleteVertex(*V1);
  return true;
}